

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.hpp
# Opt level: O0

void pstore::command_line::
     apply_to_option<pstore::command_line::opt<endian,pstore::command_line::parser<endian,void>>&,char_const(&)[7],pstore::command_line::desc_const&,pstore::command_line::details::values_const&,pstore::command_line::details::initializer<endian>const&>
               (opt<endian,_pstore::command_line::parser<endian,_void>_> *opt,char (*m0) [7],
               desc *mods,values *mods_1,initializer<endian> *mods_2)

{
  name local_50;
  initializer<endian> *local_30;
  initializer<endian> *mods_local_2;
  values *mods_local_1;
  desc *mods_local;
  char (*m0_local) [7];
  opt<endian,_pstore::command_line::parser<endian,_void>_> *opt_local;
  
  local_30 = mods_2;
  mods_local_2 = (initializer<endian> *)mods_1;
  mods_local_1 = (values *)mods;
  mods_local = (desc *)m0;
  m0_local = (char (*) [7])opt;
  make_modifier(&local_50,*m0);
  name::apply<pstore::command_line::opt<endian,pstore::command_line::parser<endian,void>>>
            (&local_50,(opt<endian,_pstore::command_line::parser<endian,_void>_> *)m0_local);
  name::~name(&local_50);
  apply_to_option<pstore::command_line::opt<endian,pstore::command_line::parser<endian,void>>&,pstore::command_line::desc_const&,pstore::command_line::details::values_const&,pstore::command_line::details::initializer<endian>const&>
            ((opt<endian,_pstore::command_line::parser<endian,_void>_> *)m0_local,
             (desc *)mods_local_1,(values *)mods_local_2,local_30);
  return;
}

Assistant:

void apply_to_option (Option && opt, M0 && m0, Mods &&... mods) {
            make_modifier (std::forward<M0> (m0)).apply (std::forward<Option> (opt));
            apply_to_option (std::forward<Option> (opt), std::forward<Mods> (mods)...);
        }